

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.cc
# Opt level: O2

base_learner * nn_setup(options_i *options,vw *all)

{
  uint64_t uVar1;
  undefined8 uVar2;
  int iVar3;
  option_group_definition *poVar4;
  ostream *poVar5;
  loss_function *plVar6;
  float *pfVar7;
  bool *pbVar8;
  polyprediction *ppVar9;
  base_learner *l;
  single_learner *base;
  learner<nn,_example> *plVar10;
  char *pcVar11;
  bool meanfield;
  free_ptr<nn> n;
  option_group_definition new_options;
  bool local_839;
  free_ptr<nn> local_838;
  allocator local_822;
  allocator local_821;
  allocator local_820;
  allocator local_81f;
  allocator local_81e;
  allocator local_81d;
  allocator local_81c;
  allocator local_81b;
  allocator local_81a;
  allocator local_819;
  string local_818;
  string local_7f8 [32];
  string local_7d8;
  string local_7b8 [32];
  string local_798;
  string local_778 [32];
  string local_758;
  string local_738 [32];
  string local_718;
  string local_6f8 [32];
  string local_6d8;
  string local_6b8;
  undefined1 local_698 [112];
  bool local_628;
  option_group_definition local_5f8;
  undefined1 local_5c0 [112];
  bool local_550;
  undefined1 local_520 [112];
  bool local_4b0;
  undefined1 local_480 [112];
  bool local_410;
  undefined1 local_3e0 [160];
  typed_option<bool> local_340;
  typed_option<bool> local_2a0;
  typed_option<bool> local_200;
  typed_option<bool> local_160;
  typed_option<unsigned_int> local_c0;
  
  scoped_calloc_or_throw<nn>();
  local_839 = false;
  std::__cxx11::string::string((string *)&local_6b8,"Neural Network",(allocator *)local_698);
  VW::config::option_group_definition::option_group_definition(&local_5f8,&local_6b8);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::__cxx11::string::string((string *)&local_6d8,"nn",&local_819);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_698,&local_6d8,
             &(local_838._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>.
              _M_head_impl)->k);
  local_628 = true;
  std::__cxx11::string::string
            (local_6f8,"Sigmoidal feedforward network with <k> hidden units",&local_81a);
  std::__cxx11::string::_M_assign((string *)(local_698 + 0x30));
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_c0,(typed_option<unsigned_int> *)local_698);
  poVar4 = VW::config::option_group_definition::add<unsigned_int>(&local_5f8,&local_c0);
  std::__cxx11::string::string((string *)&local_718,"inpass",&local_81b);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_5c0,&local_718,
             &(local_838._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>.
              _M_head_impl)->inpass);
  local_550 = true;
  std::__cxx11::string::string
            (local_738,"Train or test sigmoidal feedforward network with input passthrough.",
             &local_81c);
  std::__cxx11::string::_M_assign((string *)(local_5c0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_160,(typed_option<bool> *)local_5c0);
  poVar4 = VW::config::option_group_definition::add<bool>(poVar4,&local_160);
  std::__cxx11::string::string((string *)&local_758,"multitask",&local_81d);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_480,&local_758,
             &(local_838._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>.
              _M_head_impl)->multitask);
  local_410 = true;
  std::__cxx11::string::string(local_778,"Share hidden layer across all reduced tasks.",&local_81e);
  std::__cxx11::string::_M_assign((string *)(local_480 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_200,(typed_option<bool> *)local_480);
  poVar4 = VW::config::option_group_definition::add<bool>(poVar4,&local_200);
  std::__cxx11::string::string((string *)&local_798,"dropout",&local_81f);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_520,&local_798,
             &(local_838._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>.
              _M_head_impl)->dropout);
  local_4b0 = true;
  std::__cxx11::string::string
            (local_7b8,"Train or test sigmoidal feedforward network using dropout.",&local_820);
  std::__cxx11::string::_M_assign((string *)(local_520 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_2a0,(typed_option<bool> *)local_520);
  poVar4 = VW::config::option_group_definition::add<bool>(poVar4,&local_2a0);
  std::__cxx11::string::string((string *)&local_7d8,"meanfield",&local_821);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_3e0,&local_7d8,&local_839);
  std::__cxx11::string::string
            (local_7f8,"Train or test sigmoidal feedforward network using mean field.",&local_822);
  std::__cxx11::string::_M_assign((string *)(local_3e0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_340,(typed_option<bool> *)local_3e0);
  VW::config::option_group_definition::add<bool>(poVar4,&local_340);
  VW::config::typed_option<bool>::~typed_option(&local_340);
  std::__cxx11::string::~string(local_7f8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_3e0);
  std::__cxx11::string::~string((string *)&local_7d8);
  VW::config::typed_option<bool>::~typed_option(&local_2a0);
  std::__cxx11::string::~string(local_7b8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_520);
  std::__cxx11::string::~string((string *)&local_798);
  VW::config::typed_option<bool>::~typed_option(&local_200);
  std::__cxx11::string::~string(local_778);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_480);
  std::__cxx11::string::~string((string *)&local_758);
  VW::config::typed_option<bool>::~typed_option(&local_160);
  std::__cxx11::string::~string(local_738);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_5c0);
  std::__cxx11::string::~string((string *)&local_718);
  VW::config::typed_option<unsigned_int>::~typed_option(&local_c0);
  std::__cxx11::string::~string(local_6f8);
  VW::config::typed_option<unsigned_int>::~typed_option((typed_option<unsigned_int> *)local_698);
  std::__cxx11::string::~string((string *)&local_6d8);
  (**options->_vptr_options_i)(options,&local_5f8);
  std::__cxx11::string::string((string *)local_698,"nn",(allocator *)local_5c0);
  iVar3 = (*options->_vptr_options_i[1])(options,local_698);
  std::__cxx11::string::~string((string *)local_698);
  if ((char)iVar3 == '\0') {
    plVar10 = (learner<nn,_example> *)0x0;
  }
  else {
    (local_838._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>._M_head_impl)
    ->all = all;
    if (((local_838._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
          super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>.
         _M_head_impl)->multitask == true) && (all->quiet == false)) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"using multitask sharing for neural network ");
      pcVar11 = "testing";
      if (all->training != false) {
        pcVar11 = "training";
      }
      poVar5 = std::operator<<(poVar5,pcVar11);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    std::__cxx11::string::string((string *)local_698,"meanfield",(allocator *)local_5c0);
    iVar3 = (*options->_vptr_options_i[1])(options,local_698);
    std::__cxx11::string::~string((string *)local_698);
    if (((char)iVar3 != '\0') &&
       ((local_838._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>.
        _M_head_impl)->dropout = false, all->quiet == false)) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"using mean field for neural network ");
      pcVar11 = "testing";
      if (all->training != false) {
        pcVar11 = "training";
      }
      poVar5 = std::operator<<(poVar5,pcVar11);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    if (((local_838._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
          super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>.
         _M_head_impl)->dropout == true) && (all->quiet == false)) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"using dropout for neural network ");
      pcVar11 = "testing";
      if (all->training != false) {
        pcVar11 = "training";
      }
      poVar5 = std::operator<<(poVar5,pcVar11);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    if (((local_838._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
          super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>.
         _M_head_impl)->inpass == true) && (all->quiet == false)) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"using input passthrough for neural network ");
      pcVar11 = "testing";
      if (all->training != false) {
        pcVar11 = "training";
      }
      poVar5 = std::operator<<(poVar5,pcVar11);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    (local_838._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>._M_head_impl)
    ->finished_setup = false;
    std::__cxx11::string::string((string *)&local_818,"squared",(allocator *)local_698);
    plVar6 = getLossFunction(all,&local_818,0.0);
    (local_838._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>._M_head_impl)
    ->squared_loss = plVar6;
    std::__cxx11::string::~string((string *)&local_818);
    uVar1 = all->random_seed;
    (local_838._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>._M_head_impl)
    ->xsubi = uVar1;
    (local_838._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>._M_head_impl)
    ->save_xsubi = uVar1;
    pfVar7 = calloc_or_throw<float>
                       ((ulong)(local_838._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
                                super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.
                                super__Head_base<0UL,_nn_*,_false>._M_head_impl)->k);
    (local_838._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>._M_head_impl)
    ->hidden_units = pfVar7;
    pbVar8 = calloc_or_throw<bool>
                       ((ulong)(local_838._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
                                super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.
                                super__Head_base<0UL,_nn_*,_false>._M_head_impl)->k);
    (local_838._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>._M_head_impl)
    ->dropped_out = pbVar8;
    ppVar9 = calloc_or_throw<polyprediction>
                       ((ulong)(local_838._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
                                super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.
                                super__Head_base<0UL,_nn_*,_false>._M_head_impl)->k);
    (local_838._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>._M_head_impl)
    ->hidden_units_pred = ppVar9;
    ppVar9 = calloc_or_throw<polyprediction>
                       ((ulong)(local_838._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
                                super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.
                                super__Head_base<0UL,_nn_*,_false>._M_head_impl)->k);
    (local_838._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>._M_head_impl)
    ->hiddenbias_pred = ppVar9;
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    (local_838._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>._M_head_impl)
    ->increment = *(size_t *)(base + 0xe0);
    plVar10 = LEARNER::init_learner<nn,example,LEARNER::learner<char,example>>
                        (&local_838,base,predict_or_learn_multi<true,true>,
                         predict_or_learn_multi<false,true>,
                         (ulong)((local_838._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
                                  super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.
                                  super__Head_base<0UL,_nn_*,_false>._M_head_impl)->k + 1));
    if ((local_838._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>.
        _M_head_impl)->multitask == true) {
      *(code **)(plVar10 + 0x40) = multipredict;
    }
    uVar2 = *(undefined8 *)(plVar10 + 0x18);
    *(undefined8 *)(plVar10 + 0xb8) = uVar2;
    *(undefined8 *)(plVar10 + 0xc0) = *(undefined8 *)(plVar10 + 0x20);
    *(code **)(plVar10 + 200) = finish;
    *(undefined8 *)(plVar10 + 0x58) = uVar2;
    *(code **)(plVar10 + 0x68) = finish_example;
    *(undefined8 *)(plVar10 + 0x88) = uVar2;
    *(undefined8 *)(plVar10 + 0x90) = *(undefined8 *)(plVar10 + 0x20);
    *(code **)(plVar10 + 0x98) = end_pass;
  }
  VW::config::option_group_definition::~option_group_definition(&local_5f8);
  std::unique_ptr<nn,_void_(*)(void_*)>::~unique_ptr(&local_838);
  return (base_learner *)plVar10;
}

Assistant:

base_learner* nn_setup(options_i& options, vw& all)
{
  auto n = scoped_calloc_or_throw<nn>();
  bool meanfield = false;
  option_group_definition new_options("Neural Network");
  new_options.add(make_option("nn", n->k).keep().help("Sigmoidal feedforward network with <k> hidden units"))
      .add(make_option("inpass", n->inpass)
               .keep()
               .help("Train or test sigmoidal feedforward network with input passthrough."))
      .add(make_option("multitask", n->multitask).keep().help("Share hidden layer across all reduced tasks."))
      .add(make_option("dropout", n->dropout).keep().help("Train or test sigmoidal feedforward network using dropout."))
      .add(make_option("meanfield", meanfield).help("Train or test sigmoidal feedforward network using mean field."));
  options.add_and_parse(new_options);

  if (!options.was_supplied("nn"))
    return nullptr;

  n->all = &all;

  if (n->multitask && !all.quiet)
    std::cerr << "using multitask sharing for neural network " << (all.training ? "training" : "testing") << std::endl;

  if (options.was_supplied("meanfield"))
  {
    n->dropout = false;
    if (!all.quiet)
      std::cerr << "using mean field for neural network " << (all.training ? "training" : "testing") << std::endl;
  }

  if (n->dropout && !all.quiet)
    std::cerr << "using dropout for neural network " << (all.training ? "training" : "testing") << std::endl;

  if (n->inpass && !all.quiet)
    std::cerr << "using input passthrough for neural network " << (all.training ? "training" : "testing") << std::endl;

  n->finished_setup = false;
  n->squared_loss = getLossFunction(all, "squared", 0);

  n->xsubi = all.random_seed;

  n->save_xsubi = n->xsubi;

  n->hidden_units = calloc_or_throw<float>(n->k);
  n->dropped_out = calloc_or_throw<bool>(n->k);
  n->hidden_units_pred = calloc_or_throw<polyprediction>(n->k);
  n->hiddenbias_pred = calloc_or_throw<polyprediction>(n->k);

  auto base = as_singleline(setup_base(options, all));
  n->increment = base->increment;  // Indexing of output layer is odd.
  nn& nv = *n.get();
  learner<nn, example>& l =
      init_learner(n, base, predict_or_learn_multi<true, true>, predict_or_learn_multi<false, true>, n->k + 1);
  if (nv.multitask)
    l.set_multipredict(multipredict);
  l.set_finish(finish);
  l.set_finish_example(finish_example);
  l.set_end_pass(end_pass);

  return make_base(l);
}